

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix7.cpp
# Opt level: O1

void radix_sort7_int64(int64_t *array,size_t count)

{
  long *plVar1;
  ulong *puVar2;
  size_t pass;
  int64_t *piVar3;
  size_t sVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  int64_t *piVar7;
  int64_t *piVar8;
  long lVar9;
  int64_t *piVar10;
  int64_t *piVar11;
  ulong uVar12;
  long *__s;
  int64_t *queue_ptrs [256];
  freq_array_type freqs;
  long local_4828 [256];
  long local_4028 [2048];
  
  piVar3 = (int64_t *)operator_new__(-(ulong)(count >> 0x3d != 0) | count * 8);
  __s = local_4028;
  memset(__s,0,0x4000);
  if (count != 0) {
    sVar4 = 0;
    do {
      uVar5 = array[sVar4];
      lVar6 = 0;
      do {
        plVar1 = (long *)((long)local_4028 + lVar6 + (uVar5 & 0xff) * 8);
        *plVar1 = *plVar1 + 1;
        uVar5 = uVar5 >> 8;
        lVar6 = lVar6 + 0x800;
      } while (lVar6 != 0x4000);
      sVar4 = sVar4 + 1;
    } while (sVar4 != count);
  }
  lVar6 = 0;
  piVar8 = array;
  piVar11 = piVar3;
  do {
    lVar9 = 0;
    do {
      piVar7 = piVar11;
      piVar10 = piVar8;
      if (__s[lVar9] != 0) {
        if (__s[lVar9] != count) {
          lVar9 = 0;
          do {
            local_4828[lVar9] = (long)piVar7;
            piVar7 = piVar7 + __s[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 0x100);
          piVar7 = piVar8;
          piVar10 = piVar11;
          if (count != 0) {
            sVar4 = 0;
            do {
              uVar5 = piVar8[sVar4];
              uVar12 = uVar5 >> ((char)lVar6 * '\b' & 0x3fU) & 0xff;
              puVar2 = (ulong *)local_4828[uVar12];
              local_4828[uVar12] = (long)(puVar2 + 1);
              *puVar2 = uVar5;
              sVar4 = sVar4 + 1;
            } while (count != sVar4);
          }
        }
        break;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x100);
    lVar6 = lVar6 + 1;
    __s = __s + 0x100;
    piVar8 = piVar10;
    piVar11 = piVar7;
    if (lVar6 == 8) {
      if ((count != 0) && (piVar10 != array)) {
        memmove(array,piVar10,count * 8);
      }
      operator_delete__(piVar3);
      return;
    }
  } while( true );
}

Assistant:

void radix_sort7_int64(int64_t *array, size_t count) {
  std::unique_ptr<int64_t[]> queue_area(new int64_t[count]);
  // huge_unique_ptr<uint64_t[]> queue_area = make_huge_array<uint64_t>(count,
  // false);

  freq_array_type freqs = {};
  count_frequency(array, count, freqs);

  int64_t *from = array, *to = queue_area.get();

  for (size_t pass = 0; pass < RADIX_LEVELS; pass++) {

    if (is_trivial(freqs[pass], count)) {
      // this pass would do nothing, just skip it
      continue;
    }

    int shift = pass * RADIX_BITS;

    // array of pointers to the current position in each queue, which we set up
    // based on the known final sizes of each queue (i.e., "tighly packed")
    int64_t *queue_ptrs[RADIX_SIZE], *next = to;
    for (size_t i = 0; i < RADIX_SIZE; i++) {
      queue_ptrs[i] = next;
      next += freqs[pass][i];
    }

    // copy each element into the appropriate queue based on the current
    // RADIX_BITS sized "digit" within it
    for (size_t i = 0; i < count; i++) {
      size_t value = from[i];
      size_t index = (value >> shift) & RADIX_MASK;
      *queue_ptrs[index]++ = value;
      __builtin_prefetch(queue_ptrs[index] + 1);
    }

    // swap from and to areas
    std::swap(from, to);
  }

  // because of the last swap, the "from" area has the sorted payload: if it's
  // not the original array "a", do a final copy
  if (from != array) {
    std::copy(from, from + count, array);
  }
}